

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O3

bool __thiscall miniros::ServiceManager::isServiceAdvertised(ServiceManager *this,string *serv_name)

{
  pointer __s2;
  size_t __n;
  size_t sVar1;
  int iVar2;
  ServiceManager *pSVar3;
  
  pSVar3 = (ServiceManager *)
           (this->service_publications_).
           super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (pSVar3 != this) {
    __s2 = (serv_name->_M_dataplus)._M_p;
    __n = serv_name->_M_string_length;
    do {
      sVar1 = (pSVar3->service_publications_).
              super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
              ._M_impl._M_node._M_size;
      if ((*(size_t *)(sVar1 + 0x18) == __n) &&
         (((__n == 0 || (iVar2 = bcmp(*(void **)(sVar1 + 0x10),__s2,__n), iVar2 == 0)) &&
          (*(char *)(sVar1 + 0x100) != '\x01')))) {
        return true;
      }
      pSVar3 = (ServiceManager *)
               (pSVar3->service_publications_).
               super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    } while (pSVar3 != this);
  }
  return false;
}

Assistant:

bool ServiceManager::isServiceAdvertised(const string& serv_name)
{
  for (auto & pub : service_publications_)
  {
    if (pub->getName() == serv_name && !pub->isDropped())
      return true;
  }

  return false;
}